

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreInstPrinter.c
# Opt level: O3

void set_mem_access(MCInst *MI,_Bool status,int reg)

{
  anon_union_1768_13_9c5aee68_for_cs_detail_6 *paVar1;
  cs_detail *pcVar2;
  uint8_t *puVar3;
  
  if (MI->csh->detail == CS_OPT_ON) {
    MI->csh->doing_mem = status;
    if (status) {
      if ((reg != -0xffff) && (reg != 0xffff)) {
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x11;
        puVar3[0] = '\x03';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x15] = (uint8_t)reg;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x16] = '\0';
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x19;
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1d;
        puVar3[0] = '\x01';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        return;
      }
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + 0xff;
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x11;
      puVar3[0] = '\x03';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x16] = '\0';
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x19;
      puVar3[0] = '\0';
      puVar3[1] = '\0';
      puVar3[2] = '\0';
      puVar3[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      puVar3 = pcVar2->groups + (ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x1d;
      if (0 < reg) {
        puVar3[0] = '\x01';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        return;
      }
      puVar3[0] = 0xff;
      puVar3[1] = 0xff;
      puVar3[2] = 0xff;
      puVar3[3] = 0xff;
      return;
    }
    if (reg != 0) {
      pcVar2 = MI->flat_insn->detail;
      pcVar2->groups[(ulong)(pcVar2->field_6).x86.prefix[0] * 0x10 + 0x16] = (uint8_t)reg;
      paVar1 = &MI->flat_insn->detail->field_6;
      (paVar1->x86).prefix[0] = (paVar1->x86).prefix[0] + '\x01';
    }
  }
  return;
}

Assistant:

static void set_mem_access(MCInst *MI, bool status, int reg)
{
	if (MI->csh->detail != CS_OPT_ON)
		return;

	MI->csh->doing_mem = status;
	if (status) {
		if (reg != 0xffff && reg != -0xffff) {
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_MEM;
			if (reg) {
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = (uint8_t)reg;
			} else {
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = XCORE_REG_INVALID;
			}
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = XCORE_REG_INVALID;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = 0;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = 1;
		} else {
			// the last op should be the memory base
			MI->flat_insn->detail->xcore.op_count--;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].type = XCORE_OP_MEM;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.base = (uint8_t)MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].reg;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = XCORE_REG_INVALID;
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.disp = 0;
			if (reg > 0)
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = 1;
			else
				MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.direct = -1;
		}
	} else {
		if (reg) {
			MI->flat_insn->detail->xcore.operands[MI->flat_insn->detail->xcore.op_count].mem.index = (uint8_t)reg;
			// done, create the next operand slot
			MI->flat_insn->detail->xcore.op_count++;
		}
	}
}